

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int Strsafe_insert(char *data)

{
  uint uVar1;
  char *x;
  size_t __nmemb;
  s_x1 *psVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  s_x1node *psVar6;
  ulong uVar7;
  char **ppcVar8;
  ulong uVar9;
  s_x1node *psVar10;
  int iVar11;
  s_x1node *psVar12;
  long lVar13;
  s_x1node **ppsVar14;
  
  psVar2 = x1a;
  if (x1a != (s_x1 *)0x0) {
    uVar3 = strhash(data);
    iVar11 = psVar2->size;
    uVar7 = (ulong)(iVar11 - 1U & uVar3);
    psVar12 = (s_x1node *)psVar2->ht;
    ppsVar14 = (s_x1node **)(&psVar12->data + uVar7);
    do {
      psVar6 = *ppsVar14;
      if (psVar6 == (s_x1node *)0x0) {
        uVar1 = psVar2->count;
        if ((int)uVar1 < iVar11) {
          psVar6 = psVar2->tbl;
        }
        else {
          __nmemb = (long)iVar11 * 2;
          psVar6 = (s_x1node *)calloc(__nmemb,0x20);
          if (psVar6 == (s_x1node *)0x0) {
            return 0;
          }
          psVar12 = psVar6 + (long)iVar11 * 2;
          uVar7 = 0;
          iVar11 = (int)__nmemb;
          uVar9 = 0;
          if (0 < iVar11) {
            uVar9 = __nmemb & 0xffffffff;
          }
          for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
            (&psVar12->data)[uVar7] = (char *)0x0;
          }
          lVar13 = 0;
          uVar7 = 0;
          if (0 < (int)uVar1) {
            uVar7 = (ulong)uVar1;
          }
          for (; uVar7 * 0x18 != lVar13; lVar13 = lVar13 + 0x18) {
            x = *(char **)((long)&psVar2->tbl->data + lVar13);
            uVar5 = strhash(x);
            ppcVar8 = &psVar12->data + (uVar5 & iVar11 - 1U);
            if ((s_x1node *)*ppcVar8 == (s_x1node *)0x0) {
              psVar10 = (s_x1node *)0x0;
            }
            else {
              ((s_x1node *)*ppcVar8)->from = (s_x1node **)((long)&psVar6->next + lVar13);
              psVar10 = (s_x1node *)*ppcVar8;
            }
            *(s_x1node **)((long)&psVar6->next + lVar13) = psVar10;
            *(char **)((long)&psVar6->data + lVar13) = x;
            *(char ***)((long)&psVar6->from + lVar13) = ppcVar8;
            *ppcVar8 = (char *)((long)&psVar6->data + lVar13);
          }
          free(psVar2->tbl);
          psVar2->size = iVar11;
          psVar2->tbl = psVar6;
          psVar2->ht = (s_x1node **)psVar12;
          uVar7 = (ulong)(iVar11 - 1U & uVar3);
        }
        psVar2->count = uVar1 + 1;
        psVar10 = psVar6 + (int)uVar1;
        psVar6[(int)uVar1].data = data;
        if ((s_x1node *)(&psVar12->data)[uVar7] == (s_x1node *)0x0) {
          psVar6 = (s_x1node *)0x0;
        }
        else {
          ((s_x1node *)(&psVar12->data)[uVar7])->from = &psVar10->next;
          psVar6 = (s_x1node *)(&psVar12->data)[uVar7];
        }
        psVar10->next = psVar6;
        (&psVar12->data)[uVar7] = (char *)psVar10;
        psVar10->from = psVar2->ht + uVar7;
        return 1;
      }
      iVar4 = strcmp(psVar6->data,data);
      ppsVar14 = &psVar6->next;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

int Strsafe_insert(const char *data)
{
  x1node *np;
  unsigned h;
  unsigned ph;

  if( x1a==0 ) return 0;
  ph = strhash(data);
  h = ph & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x1a->count>=x1a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x1 array;
    array.size = size = x1a->size*2;
    array.count = x1a->count;
    array.tbl = (x1node*)calloc(size, sizeof(x1node) + sizeof(x1node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x1node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x1a->count; i++){
      x1node *oldnp, *newnp;
      oldnp = &(x1a->tbl[i]);
      h = strhash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x1a->tbl);
    *x1a = array;
  }
  /* Insert the new data */
  h = ph & (x1a->size-1);
  np = &(x1a->tbl[x1a->count++]);
  np->data = data;
  if( x1a->ht[h] ) x1a->ht[h]->from = &(np->next);
  np->next = x1a->ht[h];
  x1a->ht[h] = np;
  np->from = &(x1a->ht[h]);
  return 1;
}